

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O0

void __thiscall
t_ocaml_generator::generate_deserialize_struct
          (t_ocaml_generator *this,ostream *out,t_struct *tstruct)

{
  string *psVar1;
  string *psVar2;
  ostream *poVar3;
  string local_100;
  undefined1 local_e0 [8];
  string name;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  t_program *local_60;
  t_program *program;
  allocator local_41;
  string local_40 [8];
  string prefix;
  t_struct *tstruct_local;
  ostream *out_local;
  t_ocaml_generator *this_local;
  
  prefix.field_2._8_8_ = tstruct;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_60 = t_type::get_program((t_type *)prefix.field_2._8_8_);
  if ((local_60 != (t_program *)0x0) &&
     (local_60 != (this->super_t_oop_generator).super_t_generator.program_)) {
    psVar1 = t_program::get_name_abi_cxx11_(local_60);
    std::__cxx11::string::string((string *)(name.field_2._M_local_buf + 8),(string *)psVar1);
    t_generator::capitalize(&local_a0,(t_generator *)this,(string *)((long)&name.field_2 + 8));
    std::operator+(&local_80,&local_a0,"_types.");
    std::__cxx11::string::operator=(local_40,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  }
  psVar2 = (string *)(**(code **)(*(long *)prefix.field_2._8_8_ + 0x18))();
  std::__cxx11::string::string((string *)&local_100,psVar2);
  t_generator::decapitalize((string *)local_e0,(t_generator *)this,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  poVar3 = std::operator<<(out,"(");
  poVar3 = std::operator<<(poVar3,local_40);
  poVar3 = std::operator<<(poVar3,"read_");
  poVar3 = std::operator<<(poVar3,(string *)local_e0);
  std::operator<<(poVar3," iprot)");
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void t_ocaml_generator::generate_deserialize_struct(ostream& out, t_struct* tstruct) {
  string prefix = "";
  t_program* program = tstruct->get_program();
  if (program != nullptr && program != program_) {
    prefix = capitalize(program->get_name()) + "_types.";
  }
  string name = decapitalize(tstruct->get_name());
  out << "(" << prefix << "read_" << name << " iprot)";
}